

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  Fad<double> *pFVar3;
  double *pdVar4;
  double *pdVar5;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  *pFVar6;
  long lVar7;
  FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *pFVar8;
  uint uVar9;
  ulong uVar10;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
  *pFVar11;
  value_type vVar12;
  
  pFVar11 = (fadexpr->fadexpr_).left_;
  pFVar6 = (pFVar11->fadexpr_).left_;
  pFVar8 = (pFVar6->fadexpr_).left_;
  lVar7 = **(long **)&pFVar8->fadexpr_;
  uVar9 = *(uint *)(lVar7 + 8);
  uVar1 = ((*(Fad<double> **)((long)&pFVar8->fadexpr_ + 8))->dx_).num_elts;
  if ((int)uVar1 < (int)uVar9) {
    uVar1 = uVar9;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00e152fc;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00e152fc;
    }
    if (uVar2 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar11 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar10 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar10 = (ulong)uVar1 << 3;
    }
    pdVar5 = (double *)operator_new__(uVar10);
    (this->dx_).ptr_to_data = pdVar5;
    pFVar6 = (pFVar11->fadexpr_).left_;
    pFVar8 = (pFVar6->fadexpr_).left_;
    lVar7 = **(long **)&pFVar8->fadexpr_;
    uVar9 = *(uint *)(lVar7 + 8);
  }
  if ((uVar9 == 0) ||
     (pFVar3 = *(Fad<double> **)((long)&pFVar8->fadexpr_ + 8), (pFVar3->dx_).num_elts == 0)) {
    if (0 < (int)uVar1) {
      uVar10 = 0;
      do {
        vVar12 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
                 ::dx(&fadexpr->fadexpr_,(int)uVar10);
        pdVar5[uVar10] = vVar12;
        uVar10 = uVar10 + 1;
      } while (uVar1 != uVar10);
    }
  }
  else if (0 < (int)uVar1) {
    lVar7 = *(long *)(lVar7 + 0x10);
    pdVar4 = *(double **)((long)&pFVar3->dx_ + 8);
    uVar10 = 0;
    do {
      pdVar5[uVar10] =
           ((pdVar4[uVar10] - *(double *)(lVar7 + uVar10 * 8)) * (pFVar6->fadexpr_).right_.constant_
           * (pFVar11->fadexpr_).right_.constant_) / (fadexpr->fadexpr_).right_.constant_;
      uVar10 = uVar10 + 1;
    } while (uVar1 != uVar10);
  }
LAB_00e152fc:
  pFVar11 = (fadexpr->fadexpr_).left_;
  pFVar6 = (pFVar11->fadexpr_).left_;
  pFVar8 = (pFVar6->fadexpr_).left_;
  this->val_ = (((*(Fad<double> **)((long)&pFVar8->fadexpr_ + 8))->val_ -
                *(double *)*(pFVar8->fadexpr_).left_) * (pFVar6->fadexpr_).right_.constant_ *
               (pFVar11->fadexpr_).right_.constant_) / (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}